

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  bool bVar1;
  RegexpOp RVar2;
  Regexp *pRVar3;
  Regexp *pRVar4;
  Regexp **ppRVar5;
  Regexp *pRVar6;
  uint in_ESI;
  ParseState *in_RDI;
  Regexp *re;
  int k;
  Regexp **sub_subs;
  int i;
  PODArray<re2::Regexp_*> subs;
  Regexp *sub;
  Regexp *next;
  int n;
  Regexp *in_stack_00000118;
  int in_stack_ffffffffffffff4c;
  Regexp *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff68;
  PODArray<re2::Regexp_*> *in_stack_ffffffffffffff70;
  byte local_6a;
  byte local_69;
  Regexp *in_stack_ffffffffffffffa0;
  uint local_54;
  undefined1 in_stack_ffffffffffffffd7;
  ParseFlags in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  pRVar6 = in_RDI->stacktop_;
  pRVar4 = (Regexp *)0x0;
  while( true ) {
    local_69 = 0;
    if (pRVar6 != (Regexp *)0x0) {
      RVar2 = Regexp::op(pRVar6);
      bVar1 = IsMarker(in_RDI,RVar2);
      local_69 = bVar1 ^ 0xff;
    }
    if ((local_69 & 1) == 0) break;
    pRVar6 = pRVar6->down_;
    pRVar4 = pRVar6;
  }
  if ((in_RDI->stacktop_ == (Regexp *)0x0) || (in_RDI->stacktop_->down_ != pRVar4)) {
    PODArray<re2::Regexp_*>::PODArray
              (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    pRVar6 = in_RDI->stacktop_;
    pRVar4 = (Regexp *)0x0;
    while( true ) {
      local_6a = 0;
      if (pRVar6 != (Regexp *)0x0) {
        RVar2 = Regexp::op(pRVar6);
        bVar1 = IsMarker(in_RDI,RVar2);
        local_6a = bVar1 ^ 0xff;
      }
      if ((local_6a & 1) == 0) break;
      pRVar4 = pRVar6->down_;
      if (pRVar6->op_ == in_ESI) {
        pRVar3 = (Regexp *)Regexp::sub(pRVar6);
        local_54 = (uint)pRVar6->nsub_;
        pRVar6 = pRVar4;
        while (local_54 = local_54 - 1, -1 < (int)local_54) {
          pRVar4 = Incref(pRVar3);
          ppRVar5 = PODArray<re2::Regexp_*>::operator[]
                              ((PODArray<re2::Regexp_*> *)in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff4c);
          *ppRVar5 = pRVar4;
        }
        Decref(in_stack_ffffffffffffffa0);
        pRVar4 = pRVar6;
      }
      else {
        pRVar3 = FinishRegexp((ParseState *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              in_stack_ffffffffffffff50);
        pRVar6 = pRVar4;
        ppRVar5 = PODArray<re2::Regexp_*>::operator[]
                            ((PODArray<re2::Regexp_*> *)in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff4c);
        *ppRVar5 = pRVar3;
        pRVar4 = pRVar6;
      }
    }
    PODArray<re2::Regexp_*>::data((PODArray<re2::Regexp_*> *)0x255e0e);
    pRVar6 = ConcatOrAlternate((RegexpOp)((ulong)pRVar4 >> 0x20),(Regexp **)pRVar6,
                               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                               (bool)in_stack_ffffffffffffffd7);
    bVar1 = ComputeSimple(in_stack_00000118);
    pRVar6->simple_ = bVar1;
    pRVar6->down_ = pRVar4;
    in_RDI->stacktop_ = pRVar6;
    PODArray<re2::Regexp_*>::~PODArray((PODArray<re2::Regexp_*> *)0x255e93);
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  PODArray<Regexp*> subs(n);
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs.data(), n, flags_, true);
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}